

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c6280_mame.c
# Opt level: O2

void device_reset_c6280mame(void *chip)

{
  undefined8 *puVar1;
  long lVar2;
  
  *(undefined4 *)((long)chip + 8) = 0;
  for (lVar2 = 0x3c; lVar2 != 0x18c; lVar2 = lVar2 + 0x38) {
    *(undefined2 *)((long)chip + lVar2 + -10) = 0;
    *(undefined1 *)((long)chip + lVar2 + -8) = 0;
    *(undefined8 *)((long)chip + lVar2 + -4) = 0;
    puVar1 = (undefined8 *)((long)chip + lVar2 + -0x30);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)chip + lVar2 + -0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)chip + lVar2 + -0x13) = 0;
  }
  return;
}

Assistant:

static void device_reset_c6280mame(void* chip)
{
	c6280_t *info = (c6280_t *)chip;
	UINT8 CurChn;
	t_channel* TempChn;
	
	info->select = 0x00;
	info->balance = 0x00;
	info->lfo_frequency = 0x00;
	info->lfo_control = 0x00;
	
	for (CurChn = 0; CurChn < 6; CurChn ++)
	{
		TempChn = &info->channel[CurChn];
		
		TempChn->frequency = 0x00;
		TempChn->control = 0x00;
		TempChn->balance = 0x00;
		memset(TempChn->waveform, 0x00, 0x20);
		TempChn->index = 0x00;
		TempChn->dda = 0x00;
		TempChn->noise_control = 0x00;
		TempChn->noise_counter = 0x00;
		TempChn->counter = 0x00;
	}
	
	return;
}